

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_row(xm_context_t *ctx)

{
  uint8_t uVar1;
  ushort uVar2;
  xm_channel_context_t *pxVar3;
  bool bVar4;
  int iVar5;
  xm_context_t *in_RDI;
  xm_context_t *unaff_retaddr;
  xm_channel_context_t *ch;
  xm_pattern_slot_t *s;
  uint8_t i;
  _Bool in_a_loop;
  xm_pattern_t *cur;
  uint8_t pat_idx;
  xm_pattern_slot_t *local_40;
  xm_pattern_t *local_38;
  byte local_1a;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar6;
  
  if ((in_RDI->position_jump & 1U) == 0) {
    if ((in_RDI->pattern_break & 1U) != 0) {
      in_RDI->current_table_index = in_RDI->current_table_index + '\x01';
      in_RDI->current_row = in_RDI->jump_row;
      in_RDI->pattern_break = false;
      in_RDI->jump_row = '\0';
      xm_post_pattern_change(in_RDI);
    }
  }
  else {
    in_RDI->current_table_index = in_RDI->jump_dest;
    in_RDI->current_row = in_RDI->jump_row;
    in_RDI->position_jump = false;
    in_RDI->pattern_break = false;
    in_RDI->jump_row = '\0';
    xm_post_pattern_change(in_RDI);
  }
  bVar6 = (in_RDI->module).pattern_table[in_RDI->current_table_index];
  if ((ushort)bVar6 < (in_RDI->module).num_patterns) {
    local_38 = (in_RDI->module).patterns + (int)(uint)bVar6;
  }
  else {
    local_38 = (xm_pattern_t *)0x0;
  }
  bVar4 = false;
  for (local_1a = 0; (ushort)local_1a < (in_RDI->module).num_channels; local_1a = local_1a + 1) {
    if (local_38 == (xm_pattern_t *)0x0) {
      local_40 = &xm_row::empty_slot;
    }
    else {
      local_40 = local_38->slots +
                 (long)(int)((uint)in_RDI->current_row * (uint)(in_RDI->module).num_channels) +
                 (long)(int)(uint)local_1a;
    }
    pxVar3 = in_RDI->channels;
    pxVar3[(int)(uint)local_1a].current = local_40;
    if ((local_40->effect_type == '\x0e') && ((int)(uint)local_40->effect_param >> 4 == 0xd)) {
      pxVar3[(int)(uint)local_1a].note_delay_param = local_40->effect_param & 0xf;
    }
    else {
      xm_handle_note_and_instrument
                (unaff_retaddr,(xm_channel_context_t *)in_RDI,
                 (xm_pattern_slot_t *)CONCAT17(bVar6,in_stack_fffffffffffffff0));
    }
    if ((!bVar4) && (pxVar3[(int)(uint)local_1a].pattern_loop_count != '\0')) {
      bVar4 = true;
    }
  }
  if (!bVar4) {
    iVar5 = (uint)in_RDI->current_table_index * 0x100 + (uint)in_RDI->current_row;
    uVar1 = in_RDI->row_loop_count[iVar5];
    in_RDI->row_loop_count[iVar5] = uVar1 + '\x01';
    in_RDI->loop_count = uVar1;
  }
  in_RDI->current_row = in_RDI->current_row + '\x01';
  if (((in_RDI->position_jump & 1U) == 0) && ((in_RDI->pattern_break & 1U) == 0)) {
    if (local_38 == (xm_pattern_t *)0x0) {
      uVar2 = 0x40;
    }
    else {
      uVar2 = local_38->num_rows;
    }
    if ((uVar2 <= in_RDI->current_row) || (in_RDI->current_row == '\0')) {
      in_RDI->current_table_index = in_RDI->current_table_index + '\x01';
      in_RDI->current_row = in_RDI->jump_row;
      in_RDI->jump_row = '\0';
      xm_post_pattern_change(in_RDI);
    }
  }
  return;
}

Assistant:

static void xm_row(xm_context_t* ctx) {
	static xm_pattern_slot_t empty_slot = {0};

	if(ctx->position_jump) {
		ctx->current_table_index = ctx->jump_dest;
		ctx->current_row = ctx->jump_row;
		ctx->position_jump = false;
		ctx->pattern_break = false;
		ctx->jump_row = 0;
		xm_post_pattern_change(ctx);
	} else if(ctx->pattern_break) {
		ctx->current_table_index++;
		ctx->current_row = ctx->jump_row;
		ctx->pattern_break = false;
		ctx->jump_row = 0;
		xm_post_pattern_change(ctx);
	}

	uint8_t pat_idx = ctx->module.pattern_table[ctx->current_table_index];
	xm_pattern_t* cur = (pat_idx < ctx->module.num_patterns ? ctx->module.patterns + pat_idx : NULL);
	bool in_a_loop = false;

	/* Read notes… */
	for(uint8_t i = 0; i < ctx->module.num_channels; ++i) {
		xm_pattern_slot_t* s = (cur ? cur->slots + ctx->current_row * ctx->module.num_channels + i : &empty_slot);
		xm_channel_context_t* ch = ctx->channels + i;

		ch->current = s;

		if(s->effect_type != 0xE || s->effect_param >> 4 != 0xD) {
			xm_handle_note_and_instrument(ctx, ch, s);
		} else {
			ch->note_delay_param = s->effect_param & 0x0F;
		}

		if(!in_a_loop && ch->pattern_loop_count > 0) {
			in_a_loop = true;
		}
	}

	if(!in_a_loop) {
		/* No E6y loop is in effect (or we are in the first pass) */
		ctx->loop_count = (ctx->row_loop_count[MAX_NUM_ROWS * ctx->current_table_index + ctx->current_row]++);
	}

	ctx->current_row++; /* Since this is an uint8, this line can
						 * increment from 255 to 0, in which case it
						 * is still necessary to go the next
						 * pattern. */
	if(!ctx->position_jump && !ctx->pattern_break &&
	   (ctx->current_row >= (cur ? cur->num_rows : DEFAULT_PATTERN_LENGTH) || ctx->current_row == 0)) {
		ctx->current_table_index++;
		ctx->current_row = ctx->jump_row; /* This will be 0 most of
										   * the time, except when E60
										   * is used */
		ctx->jump_row = 0;
		xm_post_pattern_change(ctx);
	}
}